

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator
          (ImmutableMessageLiteGenerator *this,Descriptor *descriptor,Context *context)

{
  OneofDescriptor *pOVar1;
  bool bVar2;
  ClassNameResolver *pCVar3;
  Descriptor *pDVar4;
  reference ppVar5;
  Nonnull<const_char_*> failure_msg;
  long v2;
  long lVar6;
  long v1;
  string_view str;
  OneofDescriptor *oneof;
  int local_64;
  OneofDescriptor *local_60;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
  local_58;
  LogMessageFatal local_40;
  
  MessageGenerator::MessageGenerator(&this->super_MessageGenerator,descriptor);
  (this->super_MessageGenerator)._vptr_MessageGenerator =
       (_func_int **)&PTR__ImmutableMessageLiteGenerator_0084b8e0;
  this->context_ = context;
  pCVar3 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar3;
  MakeImmutableFieldLiteGenerators(&this->field_generators_,descriptor,context);
  if ((context->options_).enforce_lite != true) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/message.cc"
               ,0x3b,"!HasDescriptorMethods(descriptor->file(), context->EnforceLite())");
    str._M_str = 
    "Generator factory error: A lite message generator is used to generate non-lite messages.";
    str._M_len = 0x58;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_58,str);
LAB_002b5463:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  pDVar4 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar4->field_count_) {
    lVar6 = 0;
    v1 = 0;
    do {
      bVar2 = IsRealOneof((FieldDescriptor *)(&pDVar4->fields_->super_SymbolBase + lVar6));
      if (bVar2) {
        pDVar4 = (this->super_MessageGenerator).descriptor_;
        v2 = (long)pDVar4->field_count_;
        if (v1 < v2) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (v1,v2,"index < field_count()");
        }
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_58,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa88,failure_msg);
          goto LAB_002b5463;
        }
        pOVar1 = *(OneofDescriptor **)((long)&pDVar4->fields_->scope_ + lVar6);
        if (pOVar1 == (OneofDescriptor *)0x0) {
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
        local_64 = (int)((ulong)((long)pOVar1 - (long)pOVar1->containing_type_->oneof_decls_) >> 3)
                   * -0x49249249;
        local_60 = pOVar1;
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>>
        ::emplace<int,google::protobuf::OneofDescriptor_const*&>
                  (&local_58,&(this->super_MessageGenerator).oneofs_,&local_64,&local_60);
        ppVar5 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator*(&local_58.first);
        if (ppVar5->second != local_60) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/message.cc"
                     ,0x41,"oneofs_.emplace(oneof->index(), oneof).first->second == oneof");
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
      }
      v1 = v1 + 1;
      pDVar4 = (this->super_MessageGenerator).descriptor_;
      lVar6 = lVar6 + 0x58;
    } while (v1 < pDVar4->field_count_);
  }
  return;
}

Assistant:

ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator(
    const Descriptor* descriptor, Context* context)
    : MessageGenerator(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(MakeImmutableFieldLiteGenerators(descriptor, context)) {
  ABSL_CHECK(!HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A lite message generator is used to "
         "generate non-lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      const OneofDescriptor* oneof = descriptor_->field(i)->containing_oneof();
      ABSL_CHECK(oneofs_.emplace(oneof->index(), oneof).first->second == oneof);
    }
  }
}